

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void randomize_buffer(u32 *seed,u8 *buffer,u32 size)

{
  uint uVar1;
  
  if (3 < size) {
    do {
      uVar1 = *seed << 0xd ^ *seed;
      uVar1 = uVar1 >> 0x11 ^ uVar1;
      uVar1 = uVar1 << 5 ^ uVar1;
      *seed = uVar1;
      *(uint *)buffer = uVar1;
      buffer = (u8 *)((long)buffer + 4);
      size = size - 4;
    } while (3 < size);
  }
  if (size != 0) {
    uVar1 = *seed << 0xd ^ *seed;
    uVar1 = uVar1 >> 0x11 ^ uVar1;
    uVar1 = uVar1 << 5 ^ uVar1;
    *seed = uVar1;
    *buffer = (char)uVar1;
  }
  return;
}

Assistant:

static void randomize_buffer(u32* seed, u8* buffer, u32 size) {
  while (size >= sizeof(u32)) {
    u32 x = random_u32(seed);
    memcpy(buffer, &x, sizeof(x));
    buffer += sizeof(u32);
    size -= sizeof(u32);
  }
  if (size > 0) {
    u32 x = random_u32(seed);
    switch (size) {
      case 3: *buffer++ = x & 0xff; x >>= 8; break;
      case 2: *buffer++ = x & 0xff; x >>= 8; break;
      case 1: *buffer++ = x & 0xff; x >>= 8; break;
    }
  }
}